

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

void xmlTextReaderFreeProp(xmlTextReaderPtr reader,xmlAttrPtr cur)

{
  _xmlID *p_Var1;
  xmlParserCtxtPtr pxVar2;
  int iVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  if (xmlRegisterCallbacks != 0) {
    pp_Var4 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var4 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var4 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var4)((xmlNodePtr)cur);
    }
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlTextReaderFreeNodeList(reader,cur->children);
  }
  p_Var1 = cur->id;
  if (p_Var1 == (_xmlID *)0x0) {
    if (cur->name != (xmlChar *)0x0) {
      if (dict != (xmlDictPtr)0x0) {
        iVar3 = xmlDictOwns(dict,cur->name);
        if (iVar3 != 0) goto LAB_0017ab76;
      }
      (*xmlFree)(cur->name);
    }
    goto LAB_0017ab76;
  }
  p_Var1->attr = (xmlAttrPtr)0x0;
  if (p_Var1->name != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar3 = xmlDictOwns(dict,p_Var1->name);
      if (iVar3 != 0) goto LAB_0017ab62;
    }
    (*xmlFree)(cur->id->name);
  }
LAB_0017ab62:
  cur->id->name = cur->name;
  cur->name = (xmlChar *)0x0;
LAB_0017ab76:
  pxVar2 = reader->ctxt;
  if ((pxVar2 != (xmlParserCtxtPtr)0x0) && (iVar3 = pxVar2->freeAttrsNr, iVar3 < 100)) {
    cur->next = pxVar2->freeAttrs;
    pxVar2->freeAttrs = cur;
    pxVar2->freeAttrsNr = iVar3 + 1;
    return;
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeProp(xmlTextReaderPtr reader, xmlAttrPtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    if (cur->children != NULL)
        xmlTextReaderFreeNodeList(reader, cur->children);

    if (cur->id != NULL) {
        /*
         * Operating in streaming mode, attr is gonna disappear
         */
        cur->id->attr = NULL;
        if (cur->id->name != NULL)
            DICT_FREE(cur->id->name);
        cur->id->name = cur->name;
        cur->name = NULL;
    } else {
        DICT_FREE(cur->name);
    }

    if ((reader != NULL) && (reader->ctxt != NULL) &&
        (reader->ctxt->freeAttrsNr < MAX_FREE_NODES)) {
        cur->next = reader->ctxt->freeAttrs;
	reader->ctxt->freeAttrs = cur;
	reader->ctxt->freeAttrsNr++;
    } else {
	xmlFree(cur);
    }
}